

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::recoverFromError(Reader *this,TokenType skipUntilToken)

{
  _Map_pointer ppEVar1;
  _Map_pointer ppEVar2;
  _Elt_pointer pEVar3;
  _Elt_pointer pEVar4;
  _Elt_pointer pEVar5;
  _Elt_pointer pEVar6;
  Token skip;
  Token local_48;
  
  ppEVar1 = (this->errors_).
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  ppEVar2 = (this->errors_).
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  pEVar3 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  pEVar4 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
  pEVar5 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar6 = (this->errors_).
           super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  do {
    readToken(this,&local_48);
    if (local_48.type_ == skipUntilToken) break;
  } while (local_48.type_ != tokenEndOfStream);
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
            (&this->errors_,
             ((long)pEVar6 - (long)pEVar5 >> 6) + ((long)pEVar3 - (long)pEVar4 >> 6) +
             ((long)ppEVar1 + ((ulong)(ppEVar1 != (_Map_pointer)0x0) * -8 - (long)ppEVar2) &
             0xfffffffffffffff8));
  return false;
}

Assistant:

bool Reader::recoverFromError(TokenType skipUntilToken) {
  size_t const errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}